

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

int __thiscall
google::protobuf::io::EpsCopyOutputStream::Flush(EpsCopyOutputStream *this,uint8 *ptr)

{
  ulong uVar1;
  bool bVar2;
  uint8 *in_RSI;
  ulong *in_RDI;
  int s;
  int overrun;
  int local_b0;
  EpsCopyOutputStream *in_stack_ffffffffffffff98;
  uint8 *local_18;
  
  local_18 = in_RSI;
  while( true ) {
    bVar2 = false;
    if (in_RDI[1] != 0) {
      bVar2 = (uint8 *)*in_RDI < local_18;
    }
    local_b0 = (int)local_18;
    if (!bVar2) break;
    uVar1 = *in_RDI;
    local_18 = Next(in_stack_ffffffffffffff98);
    local_18 = local_18 + (local_b0 - (int)uVar1);
    if ((in_RDI[7] & 1) != 0) {
      return 0;
    }
  }
  if (in_RDI[1] == 0) {
    local_b0 = ((int)*in_RDI + 0x10) - local_b0;
    in_RDI[1] = (ulong)local_18;
  }
  else {
    memcpy((void *)in_RDI[1],in_RDI + 2,(long)local_18 - (long)(in_RDI + 2));
    in_RDI[1] = (ulong)(local_18 + (in_RDI[1] - (long)(in_RDI + 2)));
    local_b0 = (int)*in_RDI - local_b0;
  }
  return local_b0;
}

Assistant:

int EpsCopyOutputStream::Flush(uint8* ptr) {
  while (buffer_end_ && ptr > end_) {
    int overrun = ptr - end_;
    GOOGLE_DCHECK(!had_error_);
    GOOGLE_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
    if (had_error_) return 0;
  }
  int s;
  if (buffer_end_) {
    std::memcpy(buffer_end_, buffer_, ptr - buffer_);
    buffer_end_ += ptr - buffer_;
    s = end_ - ptr;
  } else {
    // The stream is writing directly in the ZeroCopyOutputStream buffer.
    s = end_ + kSlopBytes - ptr;
    buffer_end_ = ptr;
  }
  GOOGLE_DCHECK(s >= 0);  // NOLINT
  return s;
}